

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3CreateColumnExpr(sqlite3 *db,SrcList *pSrc,int iSrc,int iCol)

{
  Expr *pEVar1;
  int local_34;
  SrcList_item *pItem;
  Expr *p;
  int iCol_local;
  int iSrc_local;
  SrcList *pSrc_local;
  sqlite3 *db_local;
  
  pEVar1 = sqlite3ExprAlloc(db,0xa2,(Token *)0x0,0);
  if (pEVar1 != (Expr *)0x0) {
    pEVar1->y = (anon_union_8_3_c79b3df9_for_y)pSrc->a[iSrc].pTab;
    pEVar1->iTable = pSrc->a[iSrc].iCursor;
    if (((pEVar1->y).pTab)->iPKey == iCol) {
      pEVar1->iColumn = -1;
    }
    else {
      pEVar1->iColumn = (ynVar)iCol;
      local_34 = iCol;
      if (0x3f < iCol) {
        local_34 = 0x3f;
      }
      pSrc->a[iSrc].colUsed = 1L << ((byte)local_34 & 0x3f) | pSrc->a[iSrc].colUsed;
    }
  }
  return pEVar1;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3CreateColumnExpr(sqlite3 *db, SrcList *pSrc, int iSrc, int iCol){
  Expr *p = sqlite3ExprAlloc(db, TK_COLUMN, 0, 0);
  if( p ){
    struct SrcList_item *pItem = &pSrc->a[iSrc];
    p->y.pTab = pItem->pTab;
    p->iTable = pItem->iCursor;
    if( p->y.pTab->iPKey==iCol ){
      p->iColumn = -1;
    }else{
      p->iColumn = (ynVar)iCol;
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      pItem->colUsed |= ((Bitmask)1)<<(iCol>=BMS ? BMS-1 : iCol);
    }
  }
  return p;
}